

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double array_max_abs(double *array,int N)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)N;
  if (N < 1) {
    uVar3 = uVar2;
  }
  dVar4 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar1 = ABS(array[uVar2]);
    if (ABS(array[uVar2]) <= dVar4) {
      dVar1 = dVar4;
    }
    dVar4 = dVar1;
  }
  return dVar4;
}

Assistant:

double array_max_abs(double *array,int N) {
	int i;
	double m = 0.0;

	for (i = 0; i < N;++i) {
		if (fabs(array[i]) > m ) {
			m = fabs(array[i]);
		}
	}

	return m;
}